

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O0

int quicly_remote_cid_register
              (quicly_remote_cid_set_t *set,uint64_t sequence,uint8_t *cid,size_t cid_len,
              uint8_t *srt,uint64_t retire_prior_to,uint64_t *unregistered_seqs,
              size_t *num_unregistered_seqs)

{
  int iVar1;
  size_t sVar2;
  uint8_t *in_RCX;
  uint64_t in_RDX;
  quicly_remote_cid_set_t *in_RSI;
  int *in_RDI;
  size_t in_R8;
  quicly_remote_cid_set_t *in_R9;
  int ret;
  quicly_remote_cid_t backup_cid;
  undefined1 local_70 [16];
  uint64_t *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  quicly_remote_cid_set_t *in_stack_ffffffffffffffb0;
  
  memcpy(local_70,in_RDI,0x38);
  if (in_RSI < in_R9) {
    __assert_fail("sequence >= retire_prior_to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0xba,
                  "int quicly_remote_cid_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *, uint64_t, uint64_t *, size_t *)"
                 );
  }
  sVar2 = unregister_prior_to(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              in_stack_ffffffffffffffa0);
  *(size_t *)backup_cid.sequence = sVar2;
  iVar1 = do_register(in_RSI,in_RDX,in_RCX,in_R8,(uint8_t *)in_R9);
  if ((iVar1 != 0) && (*in_RDI == 0)) {
    memcpy(in_RDI,local_70,0x38);
  }
  return iVar1;
}

Assistant:

int quicly_remote_cid_register(quicly_remote_cid_set_t *set, uint64_t sequence, const uint8_t *cid, size_t cid_len,
                               const uint8_t srt[QUICLY_STATELESS_RESET_TOKEN_LEN], uint64_t retire_prior_to,
                               uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT], size_t *num_unregistered_seqs)
{
    quicly_remote_cid_t backup_cid = set->cids[0]; // preserve one valid entry in cids[0] to handle protocol violation
    int ret;

    assert(sequence >= retire_prior_to);

    /* First, handle retire_prior_to. This order is important as it is possible to receive a NEW_CONNECTION_ID frame such that it
     * retires active_connection_id_limit CIDs and then installs one new CID. */
    *num_unregistered_seqs = unregister_prior_to(set, retire_prior_to, unregistered_seqs);

    /* Then, register given value. */
    if ((ret = do_register(set, sequence, cid, cid_len, srt)) != 0) {
        /* restore the backup and send the error */
        if (!set->cids[0].is_active)
            set->cids[0] = backup_cid;
        return ret;
    }

    return ret;
}